

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O1

bool capnp::compiler::lex(ArrayPtr<const_char> input,Builder result,ErrorReporter *errorReporter)

{
  int iVar1;
  StructBuilder other;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  BuilderArena *pBVar7;
  CapTableBuilder *pCVar8;
  SegmentBuilder *pSVar9;
  char (*params) [13];
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  Orphanage orphanageParam;
  Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> parseOutput;
  ParserInput parserInput;
  Builder l;
  Sequence_<const_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_const_kj::parse::EndOfInput__&>
  parser;
  Lexer lexer;
  Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> local_188;
  StructBuilder local_168;
  ParserInput local_140;
  StructBuilder local_118;
  ListBuilder local_f0;
  Sequence_<const_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_const_kj::parse::EndOfInput__&>
  local_c8;
  Lexer local_b0;
  
  pcVar12 = input.ptr;
  local_168.dataSize = result._builder.dataSize;
  local_168.pointerCount = result._builder.pointerCount;
  local_168._38_2_ = result._builder._38_2_;
  local_168.data = result._builder.data;
  local_168.pointers = result._builder.pointers;
  local_168.segment = result._builder.segment;
  local_168.capTable = result._builder.capTable;
  pBVar7 = capnp::_::StructBuilder::getArena(&local_168);
  pCVar8 = capnp::_::StructBuilder::getCapTable(&local_168);
  orphanageParam.capTable = pCVar8;
  orphanageParam.arena = pBVar7;
  Lexer::Lexer(&local_b0,orphanageParam,errorReporter);
  local_c8.first = &local_b0.parsers.tokenSequence;
  local_c8.rest.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_140.super_IteratorInput<char,_const_char_*>.end = pcVar12 + input.size_;
  local_140.super_IteratorInput<char,_const_char_*>.parent =
       (IteratorInput<char,_const_char_*> *)0x0;
  local_140.super_IteratorInput<char,_const_char_*>.pos = pcVar12;
  local_140.super_IteratorInput<char,_const_char_*>.best = pcVar12;
  local_140.begin = pcVar12;
  kj::parse::
  Sequence_<const_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_const_kj::parse::EndOfInput__&>
  ::parseNext<capnp::compiler::Lexer::ParserInput>(&local_188,&local_c8,&local_140);
  pcVar6 = local_140.begin;
  pcVar5 = local_140.super_IteratorInput<char,_const_char_*>.best;
  pcVar12 = local_140.super_IteratorInput<char,_const_char_*>.pos;
  bVar2 = local_188.ptr.isSet;
  if (local_188.ptr.isSet == true) {
    local_168.segment = result._builder.segment;
    local_168.capTable = result._builder.capTable;
    local_168.data = result._builder.pointers;
    capnp::_::PointerBuilder::initStructList
              (&local_f0,(PointerBuilder *)&local_168,local_188.ptr.field_1.value.size_._0_4_,
               (StructSize)0x10003);
    if (local_188.ptr.field_1.value.size_ != 0) {
      uVar11 = 1;
      uVar10 = 0;
      do {
        uVar3 = local_188.ptr.field_1.value.ptr;
        capnp::_::ListBuilder::getStructElement(&local_168,&local_f0,uVar11 - 1);
        capnp::_::OrphanBuilder::asStruct
                  (&local_118,(OrphanBuilder *)(uVar3 + uVar10 * 0x20),(StructSize)0x0);
        other.capTable = local_118.capTable;
        other.segment = local_118.segment;
        other.data = local_118.data;
        other.pointers = local_118.pointers;
        other.dataSize = local_118.dataSize;
        other.pointerCount = local_118.pointerCount;
        other._38_2_ = local_118._38_2_;
        capnp::_::StructBuilder::transferContentFrom(&local_168,other);
        uVar10 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar10 < local_188.ptr.field_1.value.size_);
    }
  }
  else {
    kj::str<char_const(&)[13]>((String *)&local_168,(kj *)"Parse error.",params);
    iVar1 = (int)pcVar5;
    if (pcVar5 < pcVar12) {
      iVar1 = (int)pcVar12;
    }
    uVar11 = iVar1 - (int)pcVar6;
    pSVar9 = local_168.segment;
    if (local_168.capTable == (CapTableBuilder *)0x0) {
      pSVar9 = (SegmentBuilder *)0x515344;
    }
    (**errorReporter->_vptr_ErrorReporter)
              (errorReporter,(ulong)uVar11,(ulong)uVar11,pSVar9,
               (long)&((local_168.capTable)->super_CapTableReader)._vptr_CapTableReader +
               (ulong)(local_168.capTable == (CapTableBuilder *)0x0));
    pCVar8 = local_168.capTable;
    pSVar9 = local_168.segment;
    if (local_168.segment != (SegmentBuilder *)0x0) {
      local_168.segment = (SegmentBuilder *)0x0;
      local_168.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_168.data)(local_168.data,pSVar9,1,pCVar8,pCVar8,0);
    }
  }
  uVar4 = local_188.ptr.field_1.value.size_;
  uVar3 = local_188.ptr.field_1.value.ptr;
  if ((local_188.ptr.isSet == true) &&
     (local_188.ptr.field_1.value.ptr != (Orphan<capnp::compiler::Token> *)0x0)) {
    local_188.ptr.field_1.value.ptr = (Orphan<capnp::compiler::Token> *)0x0;
    local_188.ptr.field_1.value.size_ = 0;
    (**(local_188.ptr.field_1.value.disposer)->_vptr_ArrayDisposer)
              (local_188.ptr.field_1.value.disposer,uVar3,0x20,uVar4,uVar4,
               kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Token>,_false>::destruct);
  }
  if (local_140.super_IteratorInput<char,_const_char_*>.parent !=
      (IteratorInput<char,_const_char_*> *)0x0) {
    pcVar12 = local_140.super_IteratorInput<char,_const_char_*>.best;
    if (local_140.super_IteratorInput<char,_const_char_*>.best <
        local_140.super_IteratorInput<char,_const_char_*>.pos) {
      pcVar12 = local_140.super_IteratorInput<char,_const_char_*>.pos;
    }
    if (pcVar12 <= (local_140.super_IteratorInput<char,_const_char_*>.parent)->best) {
      pcVar12 = (local_140.super_IteratorInput<char,_const_char_*>.parent)->best;
    }
    (local_140.super_IteratorInput<char,_const_char_*>.parent)->best = pcVar12;
  }
  kj::Arena::~Arena(&local_b0.arena);
  return bVar2;
}

Assistant:

bool lex(kj::ArrayPtr<const char> input, LexedTokens::Builder result,
         ErrorReporter& errorReporter) {
  Lexer lexer(Orphanage::getForMessageContaining(result), errorReporter);

  auto parser = p::sequence(lexer.getParsers().tokenSequence, p::endOfInput);

  Lexer::ParserInput parserInput(input.begin(), input.end());
  kj::Maybe<kj::Array<Orphan<Token>>> parseOutput = parser(parserInput);

  KJ_IF_MAYBE(output, parseOutput) {
    auto l = result.initTokens(output->size());
    for (uint i = 0; i < output->size(); i++) {
      l.adoptWithCaveats(i, kj::mv((*output)[i]));
    }
    return true;
  } else {
    uint32_t best = parserInput.getBest();
    errorReporter.addError(best, best, kj::str("Parse error."));
    return false;
  }